

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::GetConfigCommonSourceFiles
          (cmGeneratorTarget *this,vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files)

{
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *this_00;
  cmLocalGenerator *this_01;
  bool bVar1;
  reference config;
  reference pbVar2;
  reference ppcVar3;
  ostream *poVar4;
  string *psVar5;
  string local_2f8;
  string local_2d8 [32];
  undefined1 local_2b8 [8];
  ostringstream e;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_140;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_138;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_130;
  const_iterator fi_1;
  string thisConfigFiles;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_100;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_f8;
  const_iterator fi;
  char *sep;
  string firstConfigFiles;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> configFiles;
  string *firstConfig;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  const_iterator it;
  value_type local_88;
  string local_58;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files_local;
  cmGeneratorTarget *this_local;
  
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)files;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  cmMakefile::GetConfigurations
            (&local_58,this->Makefile,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38,true);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,"",(allocator *)((long)&it._M_current + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  }
  firstConfig = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_38);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_98,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&firstConfig);
  config = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_98);
  GetSourceFiles(this,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                      configs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,config);
  while( true ) {
    configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_38);
    bVar1 = __gnu_cxx::operator!=
                      (&local_98,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&configFiles.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    this_00 = (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
              ((long)&firstConfigFiles.field_2 + 8);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector(this_00);
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_98);
    GetSourceFiles(this,this_00,pbVar2);
    bVar1 = std::operator!=((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                            ((long)&firstConfigFiles.field_2 + 8),
                            (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                            configs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      std::__cxx11::string::string((string *)&sep);
      fi._M_current = (cmSourceFile **)0xad0413;
      local_100._M_current =
           (cmSourceFile **)
           std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                     ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                      configs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
      ::__normal_iterator<cmSourceFile**>
                ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                  *)&local_f8,&local_100);
      while( true ) {
        thisConfigFiles.field_2._8_8_ =
             std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                       ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                        configs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar1 = __gnu_cxx::operator!=
                          (&local_f8,
                           (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                            *)((long)&thisConfigFiles.field_2 + 8));
        if (!bVar1) break;
        std::__cxx11::string::operator+=((string *)&sep,(char *)fi._M_current);
        ppcVar3 = __gnu_cxx::
                  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                  ::operator*(&local_f8);
        psVar5 = cmSourceFile::GetFullPath(*ppcVar3,(string *)0x0);
        std::__cxx11::string::operator+=((string *)&sep,(string *)psVar5);
        fi._M_current = (cmSourceFile **)0xaa2400;
        __gnu_cxx::
        __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
        ::operator++(&local_f8);
      }
      std::__cxx11::string::string((string *)&fi_1);
      fi._M_current = (cmSourceFile **)0xad0413;
      local_138._M_current =
           (cmSourceFile **)
           std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                     ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                      ((long)&firstConfigFiles.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
      ::__normal_iterator<cmSourceFile**>
                ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                  *)&local_130,&local_138);
      while( true ) {
        local_140._M_current =
             (cmSourceFile **)
             std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                       ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                        ((long)&firstConfigFiles.field_2 + 8));
        bVar1 = __gnu_cxx::operator!=(&local_130,&local_140);
        if (!bVar1) break;
        std::__cxx11::string::operator+=((string *)&fi_1,(char *)fi._M_current);
        ppcVar3 = __gnu_cxx::
                  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                  ::operator*(&local_130);
        psVar5 = cmSourceFile::GetFullPath(*ppcVar3,(string *)0x0);
        std::__cxx11::string::operator+=((string *)&fi_1,(string *)psVar5);
        fi._M_current = (cmSourceFile **)0xaa2400;
        __gnu_cxx::
        __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
        ::operator++(&local_130);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
      poVar4 = std::operator<<((ostream *)local_2b8,"Target \"");
      psVar5 = GetName_abi_cxx11_(this);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4,
                               "\" has source files which vary by configuration. This is not supported by the \""
                              );
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_2d8);
      poVar4 = std::operator<<(poVar4,local_2d8);
      poVar4 = std::operator<<(poVar4,"\" generator.\nConfig \"");
      poVar4 = std::operator<<(poVar4,(string *)config);
      poVar4 = std::operator<<(poVar4,"\":\n  ");
      poVar4 = std::operator<<(poVar4,(string *)&sep);
      poVar4 = std::operator<<(poVar4,"\nConfig \"");
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_98);
      poVar4 = std::operator<<(poVar4,(string *)pbVar2);
      poVar4 = std::operator<<(poVar4,"\":\n  ");
      poVar4 = std::operator<<(poVar4,(string *)&fi_1);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string(local_2d8);
      this_01 = this->LocalGenerator;
      std::__cxx11::ostringstream::str();
      cmLocalGenerator::IssueMessage(this_01,FATAL_ERROR,&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      this_local._7_1_ = 0;
      bVar1 = true;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
      std::__cxx11::string::~string((string *)&fi_1);
      std::__cxx11::string::~string((string *)&sep);
    }
    else {
      bVar1 = false;
    }
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
               ((long)&firstConfigFiles.field_2 + 8));
    if (bVar1) goto LAB_0083ff31;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_98);
  }
  this_local._7_1_ = 1;
LAB_0083ff31:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGeneratorTarget::GetConfigCommonSourceFiles(
    std::vector<cmSourceFile*>& files) const
{
  std::vector<std::string> configs;
  this->Makefile->GetConfigurations(configs);
  if (configs.empty())
    {
    configs.push_back("");
    }

  std::vector<std::string>::const_iterator it = configs.begin();
  const std::string& firstConfig = *it;
  this->GetSourceFiles(files, firstConfig);

  for ( ; it != configs.end(); ++it)
    {
    std::vector<cmSourceFile*> configFiles;
    this->GetSourceFiles(configFiles, *it);
    if (configFiles != files)
      {
      std::string firstConfigFiles;
      const char* sep = "";
      for (std::vector<cmSourceFile*>::const_iterator fi = files.begin();
           fi != files.end(); ++fi)
        {
        firstConfigFiles += sep;
        firstConfigFiles += (*fi)->GetFullPath();
        sep = "\n  ";
        }

      std::string thisConfigFiles;
      sep = "";
      for (std::vector<cmSourceFile*>::const_iterator fi = configFiles.begin();
           fi != configFiles.end(); ++fi)
        {
        thisConfigFiles += sep;
        thisConfigFiles += (*fi)->GetFullPath();
        sep = "\n  ";
        }
      std::ostringstream e;
      e << "Target \"" << this->GetName()
        << "\" has source files which vary by "
        "configuration. This is not supported by the \""
        << this->GlobalGenerator->GetName()
        << "\" generator.\n"
          "Config \"" << firstConfig << "\":\n"
          "  " << firstConfigFiles << "\n"
          "Config \"" << *it << "\":\n"
          "  " << thisConfigFiles << "\n";
      this->LocalGenerator->IssueMessage(cmake::FATAL_ERROR, e.str());
      return false;
      }
    }
  return true;
}